

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O0

Cba_Man_t * Cba_ManReadVerilog(char *pFileName)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *vDes;
  Cba_Man_t *p;
  char *pFileName_local;
  
  vDes = (Vec_Ptr_t *)0x0;
  p_00 = Prs_ManReadVerilog(pFileName);
  if (p_00 != (Vec_Ptr_t *)0x0) {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 != 0) {
      vDes = (Vec_Ptr_t *)Prs_ManBuildCbaVerilog(pFileName,p_00);
    }
  }
  if (p_00 != (Vec_Ptr_t *)0x0) {
    Prs_ManVecFree(p_00);
  }
  return (Cba_Man_t *)vDes;
}

Assistant:

Cba_Man_t * Cba_ManReadVerilog( char * pFileName )
{
    Cba_Man_t * p = NULL;
    Vec_Ptr_t * vDes = Prs_ManReadVerilog( pFileName );
    if ( vDes && Vec_PtrSize(vDes) )
        p = Prs_ManBuildCbaVerilog( pFileName, vDes );
    if ( vDes )
        Prs_ManVecFree( vDes );
    return p;
}